

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_testutils.h
# Opt level: O0

void lf::uscalfe::test::
     SecOrdBVPLagrFEFullInteriorGalMat<double,lf::assemble::COOMatrix<double>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_gfe_a_dir_dbg_3_Test::TestBody()::__1>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_gfe_a_dir_dbg_3_Test::TestBody()::__2>>
               (shared_ptr<lf::uscalfe::UniformScalarFESpace<double>_> *fe_space,
               MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>
               *alpha,MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>
                      *gamma,COOMatrix<double> *A)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>
  local_2d0;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>
  local_2c0;
  shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> local_2b0;
  undefined1 local_2a0 [8];
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>_>
  elmat_builder;
  DofHandler *dofh;
  element_type *local_30;
  Mesh *mesh;
  COOMatrix<double> *A_local;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>
  *gamma_local;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>
  *alpha_local;
  shared_ptr<lf::uscalfe::UniformScalarFESpace<double>_> *fe_space_local;
  
  mesh = (Mesh *)A;
  A_local = (COOMatrix<double> *)gamma;
  gamma_local = (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>
                 *)alpha;
  alpha_local = (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>
                 *)fe_space;
  peVar2 = std::
           __shared_ptr_access<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)fe_space);
  (**(peVar2->super_ScalarFESpace<double>)._vptr_ScalarFESpace)();
  peVar3 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&dofh);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)&dofh);
  local_30 = peVar3;
  peVar2 = std::
           __shared_ptr_access<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)fe_space);
  iVar1 = (*(peVar2->super_ScalarFESpace<double>)._vptr_ScalarFESpace[1])();
  elmat_builder.fe_precomp_._M_elems[4].grad_shape_fun_.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       CONCAT44(extraout_var,iVar1);
  std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>::
  shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,void>
            ((shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const> *)&local_2b0,fe_space);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:101:48)>
  ::MeshFunctionGlobal(&local_2c0,alpha);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:106:7)>
  ::MeshFunctionGlobal(&local_2d0,gamma);
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:101:48)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:106:7)>_>
  ::ReactionDiffusionElementMatrixProvider
            ((ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>_>
              *)local_2a0,&local_2b0,&local_2c0,&local_2d0);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:106:7)>
  ::~MeshFunctionGlobal(&local_2d0);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:101:48)>
  ::~MeshFunctionGlobal(&local_2c0);
  std::shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_>::~shared_ptr(&local_2b0);
  assemble::
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_lf::uscalfe::ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>_>_>
            (0,(DofHandler *)
               elmat_builder.fe_precomp_._M_elems[4].grad_shape_fun_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (DofHandler *)
             elmat_builder.fe_precomp_._M_elems[4].grad_shape_fun_.
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>_>
              *)local_2a0,(COOMatrix<double> *)mesh);
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:101:48)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:106:7)>_>
  ::~ReactionDiffusionElementMatrixProvider
            ((ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>_>
              *)local_2a0);
  return;
}

Assistant:

void SecOrdBVPLagrFEFullInteriorGalMat(
    std::shared_ptr<UniformScalarFESpace<SCALAR>> fe_space, DIFF_COEFF alpha,
    REACTION_COEFF gamma, TMPMATRIX &A) {
  using scalar_t = typename TMPMATRIX::Scalar;
  // The underlying finite element mesh
  const lf::mesh::Mesh &mesh{*fe_space->Mesh()};
  // The local-to-global index map for the finite element space
  const lf::assemble::DofHandler &dofh{fe_space->LocGlobMap()};
  // Object taking care of local computations. No selection of a subset
  // of cells is specified.
  ReactionDiffusionElementMatrixProvider<scalar_t, decltype(alpha),
                                         decltype(gamma)>
      elmat_builder(fe_space, alpha, gamma);
  // Invoke assembly on cells
  AssembleMatrixLocally(0, dofh, dofh, elmat_builder, A);
}